

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.h
# Opt level: O2

int64_t floatx80_to_int64_round_to_zero_aarch64(floatx80 a,float_status *status)

{
  ushort uVar1;
  ushort uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = a.low;
  uVar1 = a.high;
  uVar2 = uVar1 & 0x7fff;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 || (long)uVar3 < 0)
  {
    if (uVar2 < 0x403e) {
      if (uVar2 < 0x3fff) {
        if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 || uVar3 != 0)
        {
          status->float_exception_flags = status->float_exception_flags | 0x20;
        }
        return 0;
      }
      uVar4 = uVar3 >> (0x3eU - (char)uVar2 & 0x3f);
      if (uVar3 << ((char)uVar2 + 2U & 0x3f) != 0) {
        status->float_exception_flags = status->float_exception_flags | 0x20;
      }
      uVar3 = -uVar4;
      if (-1 < (short)uVar1) {
        uVar3 = uVar4;
      }
      return uVar3;
    }
    if (uVar1 != 0xc03e ||
        ((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) {
      status->float_exception_flags = status->float_exception_flags | 1;
      if ((-1 < (short)uVar1) ||
         (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0 &&
          uVar2 == 0x7fff)) {
        return 0x7fffffffffffffff;
      }
    }
  }
  else {
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  return -0x8000000000000000;
}

Assistant:

static inline bool floatx80_invalid_encoding(floatx80 a)
{
    return (a.low & (1ULL << 63)) == 0 && (a.high & 0x7FFF) != 0;
}